

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int same_symbol(symbol *a,symbol *b)

{
  symbol **ppsVar1;
  symbol **ppsVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (a != b) {
    if (a->type != MULTITERMINAL) {
      return 0;
    }
    if (b->type != MULTITERMINAL) {
      return 0;
    }
    uVar3 = a->nsubsym;
    if (uVar3 != b->nsubsym) {
      return 0;
    }
    uVar4 = 0;
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = uVar4;
    }
    while (uVar5 != uVar4) {
      ppsVar1 = a->subsym + uVar4;
      ppsVar2 = b->subsym + uVar4;
      uVar4 = uVar4 + 1;
      if (*ppsVar1 != *ppsVar2) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int same_symbol(struct symbol *a, struct symbol *b)
{
  int i;
  if( a==b ) return 1;
  if( a->type!=MULTITERMINAL ) return 0;
  if( b->type!=MULTITERMINAL ) return 0;
  if( a->nsubsym!=b->nsubsym ) return 0;
  for(i=0; i<a->nsubsym; i++){
    if( a->subsym[i]!=b->subsym[i] ) return 0;
  }
  return 1;
}